

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

void __thiscall setup::directory_entry::load(directory_entry *this,istream *is,info *i)

{
  log_level lVar1;
  byte *pbVar2;
  logger *plVar3;
  size_t i_1;
  ulong uVar4;
  flag_type result;
  _WordT _Var5;
  uint64_t set_bits;
  ulong uVar6;
  ostringstream *poVar7;
  char buffer [4];
  logger local_1a0;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)&local_1a0);
  }
  util::encoded_string::load(is,&this->name,i->codepage,&(i->header).lead_bytes);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value + 0xfbfff500 < 0xf500) {
    util::binary_string::load(is,&this->permissions);
  }
  else {
    (this->permissions)._M_string_length = 0;
    *(this->permissions)._M_dataplus._M_p = '\0';
  }
  lVar1 = Debug;
  if (0x2000aff < (i->version).value) {
    std::istream::read((char *)is,(long)&local_1a0);
    lVar1 = local_1a0.level;
  }
  this->attributes = lVar1;
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  if ((i->version).value < 0x4010000) {
    this->permission = -1;
LAB_00135094:
    if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
      std::istream::read((char *)is,(long)&local_1a0);
      uVar6 = (ulong)(byte)(undefined1)local_1a0.level;
      pbVar2 = &(anonymous_namespace)::stored_inno_directory_options_0::values;
      uVar4 = 0;
      _Var5 = 0;
      do {
        if ((uVar6 >> (uVar4 & 0x3f) & 1) != 0) {
          _Var5 = _Var5 | 1L << ((ulong)*pbVar2 & 0x3f);
          uVar6 = uVar6 & ~(1L << ((byte)uVar4 & 0x3f));
        }
        uVar4 = uVar4 + 1;
        pbVar2 = pbVar2 + 4;
      } while (uVar4 != 3);
      if (uVar6 == 0) goto LAB_0013525f;
      local_1a0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0.buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0.buffer,"Unexpected ",0xb);
      plVar3 = logger::operator<<(&local_1a0,&enum_names<setup::directory_entry::flags_Enum_>::name)
      ;
      poVar7 = &plVar3->buffer;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," flags: ",8);
      *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) =
           *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    }
    else {
      std::istream::read((char *)is,(long)&local_1a0);
      uVar6 = (ulong)(byte)(undefined1)local_1a0.level;
      pbVar2 = &(anonymous_namespace)::stored_inno_directory_options_0::values;
      uVar4 = 0;
      _Var5 = 0;
      do {
        if ((uVar6 >> (uVar4 & 0x3f) & 1) != 0) {
          _Var5 = _Var5 | 1L << ((ulong)*pbVar2 & 0x3f);
          uVar6 = uVar6 & ~(1L << ((byte)uVar4 & 0x3f));
        }
        uVar4 = uVar4 + 1;
        pbVar2 = pbVar2 + 4;
      } while (uVar4 != 3);
      if (uVar6 == 0) goto LAB_0013525f;
      local_1a0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0.buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0.buffer,"Unexpected ",0xb);
      plVar3 = logger::operator<<(&local_1a0,&enum_names<setup::directory_entry::flags_Enum_>::name)
      ;
      poVar7 = &plVar3->buffer;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," flags: ",8);
      *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) =
           *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    }
  }
  else {
    std::istream::read((char *)is,(long)&local_1a0);
    this->permission = (undefined2)local_1a0.level;
    if ((i->version).value < 0x5020000) goto LAB_00135094;
    std::istream::read((char *)is,(long)&local_1a0);
    uVar6 = (ulong)(byte)(undefined1)local_1a0.level;
    pbVar2 = &(anonymous_namespace)::stored_inno_directory_options_1::values;
    uVar4 = 0;
    _Var5 = 0;
    do {
      if ((uVar6 >> (uVar4 & 0x3f) & 1) != 0) {
        _Var5 = _Var5 | 1L << ((ulong)*pbVar2 & 0x3f);
        uVar6 = uVar6 & ~(1L << ((byte)uVar4 & 0x3f));
      }
      uVar4 = uVar4 + 1;
      pbVar2 = pbVar2 + 4;
    } while (uVar4 != 5);
    if (uVar6 == 0) goto LAB_0013525f;
    local_1a0.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.buffer,"Unexpected ",0xb);
    plVar3 = logger::operator<<(&local_1a0,&enum_names<setup::directory_entry::flags_Enum_>::name);
    poVar7 = &plVar3->buffer;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," flags: ",8);
    *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) =
         *(uint *)(&plVar3->field_0x20 + *(long *)(*(long *)poVar7 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
  logger::~logger(&local_1a0);
LAB_0013525f:
  (this->options)._flags.super__Base_bitset<1UL>._M_w = _Var5;
  return;
}

Assistant:

void directory_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	if(i.version >= INNO_VERSION(2, 0, 11)) {
		attributes = util::load<boost::uint32_t>(is);
	} else {
		attributes = 0;
	}
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = boost::int16_t(-1);
	}
	
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		options = stored_flags<stored_inno_directory_options_1>(is).get();
	} else if(i.version.bits() != 16) {
		options = stored_flags<stored_inno_directory_options_0>(is).get();
	} else {
		options = stored_flags<stored_inno_directory_options_0, 16>(is).get();
	}
	
}